

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::Message
          (Message *this,message_order *hdrOrder,message_order *trlOrder,message_order *order,
          string *string,DataDictionary *dataDictionary,bool validate)

{
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001ef568;
  Header::Header(&this->m_header,hdrOrder);
  Trailer::Trailer(&this->m_trailer,trlOrder);
  this->m_validStructure = true;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

Message::Message( const message_order &hdrOrder,
                  const message_order &trlOrder,
                  const message_order& order,
                  const std::string& string,
                  const DataDictionary& dataDictionary,
                  bool validate )
EXCEPT ( InvalidMessage )
: FieldMap(order), m_header(hdrOrder),
  m_trailer(trlOrder), m_validStructure( true )
{
  setString( string, validate, &dataDictionary, &dataDictionary );
}